

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_elements_confidentialtxout.cpp
# Opt level: O1

void __thiscall
ConfidentialTxOut_CreateDestroyAmountTxOutTest_Test::TestBody
          (ConfidentialTxOut_CreateDestroyAmountTxOutTest_Test *this)

{
  bool *pbVar1;
  bool bVar2;
  char *pcVar3;
  Amount AVar4;
  AssertionResult gtest_ar_1;
  AssertionResult gtest_ar_2;
  AssertionResult gtest_ar;
  ConfidentialAssetId asset;
  ConfidentialTxOut txout;
  string local_290;
  undefined1 local_270 [8];
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_268;
  char local_260 [16];
  int64_t local_250;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_248;
  Amount local_240;
  ConfidentialTxOut local_230;
  ConfidentialAssetId local_138;
  int64_t local_110;
  ConfidentialTxOut local_108;
  
  cfd::core::ConfidentialTxOut::ConfidentialTxOut(&local_108);
  pbVar1 = &local_230.super_AbstractTxOut.value_.ignore_check_;
  local_230.super_AbstractTxOut._vptr_AbstractTxOut = (_func_int **)pbVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_230,"1234567890123456789012345678901234567890123456789012345678901234"
             ,"");
  cfd::core::ConfidentialAssetId::ConfidentialAssetId(&local_138,(string *)&local_230);
  if (local_230.super_AbstractTxOut._vptr_AbstractTxOut != (_func_int **)pbVar1) {
    operator_delete(local_230.super_AbstractTxOut._vptr_AbstractTxOut);
  }
  AVar4 = cfd::core::Amount::CreateBySatoshiAmount(980000000);
  local_240.amount_ = AVar4.amount_;
  local_240.ignore_check_ = AVar4.ignore_check_;
  bVar2 = testing::internal::AlwaysTrue();
  if (bVar2) {
    bVar2 = testing::internal::AlwaysTrue();
    if (bVar2) {
      cfd::core::ConfidentialTxOut::CreateDestroyAmountTxOut(&local_230,&local_138,&local_240);
      local_108.super_AbstractTxOut.value_.ignore_check_ =
           local_230.super_AbstractTxOut.value_.ignore_check_;
      local_108.super_AbstractTxOut.value_.amount_ = local_230.super_AbstractTxOut.value_.amount_;
      cfd::core::Script::operator=
                (&local_108.super_AbstractTxOut.locking_script_,
                 &local_230.super_AbstractTxOut.locking_script_);
      cfd::core::ConfidentialAssetId::operator=(&local_108.asset_,&local_230.asset_);
      cfd::core::ConfidentialValue::operator=
                (&local_108.confidential_value_,&local_230.confidential_value_);
      cfd::core::ConfidentialNonce::operator=(&local_108.nonce_,&local_230.nonce_);
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
                (&local_108.surjection_proof_.data_,&local_230.surjection_proof_.data_);
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
                (&local_108.range_proof_.data_,&local_230.range_proof_.data_);
      cfd::core::ConfidentialTxOut::~ConfidentialTxOut(&local_230);
    }
  }
  else {
    testing::Message::Message((Message *)&local_230);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_290,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_elements_confidentialtxout.cpp"
               ,0x125,
               "Expected: (txout = ConfidentialTxOut::CreateDestroyAmountTxOut(asset, amount)) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_290,(Message *)&local_230);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_290);
    if (local_230.super_AbstractTxOut._vptr_AbstractTxOut != (_func_int **)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) && (local_230.super_AbstractTxOut._vptr_AbstractTxOut != (_func_int **)0x0)) {
        (**(code **)((long)*local_230.super_AbstractTxOut._vptr_AbstractTxOut + 8))();
      }
      local_230.super_AbstractTxOut._vptr_AbstractTxOut = (_func_int **)0x0;
    }
  }
  cfd::core::ConfidentialAssetId::ConfidentialAssetId
            ((ConfidentialAssetId *)&local_230,&local_108.asset_);
  cfd::core::ConfidentialAssetId::GetHex_abi_cxx11_(&local_290,(ConfidentialAssetId *)&local_230);
  pcVar3 = (char *)CONCAT71(local_290._M_dataplus._M_p._1_7_,(char)local_290._M_dataplus._M_p);
  cfd::core::ConfidentialAssetId::GetHex_abi_cxx11_((string *)local_270,&local_138);
  testing::internal::CmpHelperSTREQ
            ((internal *)&local_250,"txout.GetAsset().GetHex().c_str()","asset.GetHex().c_str()",
             pcVar3,(char *)local_270);
  if (local_270 != (undefined1  [8])local_260) {
    operator_delete((void *)local_270);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT71(local_290._M_dataplus._M_p._1_7_,(char)local_290._M_dataplus._M_p) !=
      &local_290.field_2) {
    operator_delete((undefined1 *)
                    CONCAT71(local_290._M_dataplus._M_p._1_7_,(char)local_290._M_dataplus._M_p));
  }
  local_230.super_AbstractTxOut._vptr_AbstractTxOut =
       (_func_int **)&PTR__ConfidentialAssetId_006a21d8;
  if ((void *)local_230.super_AbstractTxOut.value_.amount_ != (void *)0x0) {
    operator_delete((void *)local_230.super_AbstractTxOut.value_.amount_);
  }
  if (local_250._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&local_230);
    if (local_248.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((local_248.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_290,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_elements_confidentialtxout.cpp"
               ,0x126,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_290,(Message *)&local_230);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_290);
    if (local_230.super_AbstractTxOut._vptr_AbstractTxOut != (_func_int **)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) && (local_230.super_AbstractTxOut._vptr_AbstractTxOut != (_func_int **)0x0)) {
        (**(code **)(*local_230.super_AbstractTxOut._vptr_AbstractTxOut + 8))();
      }
      local_230.super_AbstractTxOut._vptr_AbstractTxOut = (_func_int **)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_248,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  cfd::core::ConfidentialValue::ConfidentialValue
            ((ConfidentialValue *)&local_230,&local_108.confidential_value_);
  AVar4 = cfd::core::ConfidentialValue::GetAmount((ConfidentialValue *)&local_230);
  local_270 = (undefined1  [8])AVar4.amount_;
  local_268.ptr_._0_1_ = AVar4.ignore_check_;
  local_250 = cfd::core::Amount::GetSatoshiValue((Amount *)local_270);
  local_110 = cfd::core::Amount::GetSatoshiValue(&local_240);
  testing::internal::CmpHelperEQ<long,long>
            ((internal *)&local_290,"txout.GetConfidentialValue().GetAmount().GetSatoshiValue()",
             "amount.GetSatoshiValue()",&local_250,&local_110);
  local_230.super_AbstractTxOut._vptr_AbstractTxOut = (_func_int **)&PTR__ConfidentialValue_006a2070
  ;
  if ((void *)local_230.super_AbstractTxOut.value_.amount_ != (void *)0x0) {
    operator_delete((void *)local_230.super_AbstractTxOut.value_.amount_);
  }
  if ((char)local_290._M_dataplus._M_p == '\0') {
    testing::Message::Message((Message *)&local_230);
    if ((undefined8 *)local_290._M_string_length == (undefined8 *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = *(char **)local_290._M_string_length;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_270,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_elements_confidentialtxout.cpp"
               ,0x128,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_270,(Message *)&local_230);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_270);
    if (local_230.super_AbstractTxOut._vptr_AbstractTxOut != (_func_int **)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) && (local_230.super_AbstractTxOut._vptr_AbstractTxOut != (_func_int **)0x0)) {
        (**(code **)(*local_230.super_AbstractTxOut._vptr_AbstractTxOut + 8))();
      }
      local_230.super_AbstractTxOut._vptr_AbstractTxOut = (_func_int **)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_290._M_string_length,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  cfd::core::AbstractTxOut::GetLockingScript((Script *)&local_230,&local_108.super_AbstractTxOut);
  cfd::core::Script::ToString_abi_cxx11_(&local_290,(Script *)&local_230);
  testing::internal::CmpHelperSTREQ
            ((internal *)local_270,"txout.GetLockingScript().ToString().c_str()","\"OP_RETURN\"",
             (char *)CONCAT71(local_290._M_dataplus._M_p._1_7_,(char)local_290._M_dataplus._M_p),
             "OP_RETURN");
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT71(local_290._M_dataplus._M_p._1_7_,(char)local_290._M_dataplus._M_p) !=
      &local_290.field_2) {
    operator_delete((undefined1 *)
                    CONCAT71(local_290._M_dataplus._M_p._1_7_,(char)local_290._M_dataplus._M_p));
  }
  cfd::core::Script::~Script((Script *)&local_230);
  if (local_270[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_230);
    if ((undefined8 *)CONCAT71(local_268.ptr_._1_7_,local_268.ptr_._0_1_) == (undefined8 *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = *(char **)CONCAT71(local_268.ptr_._1_7_,local_268.ptr_._0_1_);
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_290,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_elements_confidentialtxout.cpp"
               ,0x129,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_290,(Message *)&local_230);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_290);
    if (local_230.super_AbstractTxOut._vptr_AbstractTxOut != (_func_int **)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) && (local_230.super_AbstractTxOut._vptr_AbstractTxOut != (_func_int **)0x0)) {
        (**(code **)(*local_230.super_AbstractTxOut._vptr_AbstractTxOut + 8))();
      }
      local_230.super_AbstractTxOut._vptr_AbstractTxOut = (_func_int **)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_268,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_138._vptr_ConfidentialAssetId = (_func_int **)&PTR__ConfidentialAssetId_006a21d8;
  if (local_138.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_138.data_.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  cfd::core::ConfidentialTxOut::~ConfidentialTxOut(&local_108);
  return;
}

Assistant:

TEST(ConfidentialTxOut, CreateDestroyAmountTxOutTest) {  
  ConfidentialTxOut txout;
  ConfidentialAssetId asset("1234567890123456789012345678901234567890123456789012345678901234");
  Amount amount = Amount::CreateBySatoshiAmount(980000000);
  EXPECT_NO_THROW((txout = ConfidentialTxOut::CreateDestroyAmountTxOut(asset, amount)));
  EXPECT_STREQ(txout.GetAsset().GetHex().c_str(), asset.GetHex().c_str());
  EXPECT_EQ(txout.GetConfidentialValue().GetAmount().GetSatoshiValue(),
            amount.GetSatoshiValue());
  EXPECT_STREQ(txout.GetLockingScript().ToString().c_str(), "OP_RETURN");
}